

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_timer.c
# Opt level: O0

int amqp_timer_update(amqp_timer_t *timer,timeval *timeout)

{
  uint64_t uVar1;
  long *in_RSI;
  ulong *in_RDI;
  int local_4;
  
  if (*in_RDI == 0) {
    uVar1 = amqp_get_monotonic_timestamp();
    *in_RDI = uVar1;
    if (*in_RDI == 0) {
      return -0xe;
    }
    in_RDI[1] = *in_RDI + *in_RSI * 1000000000 + in_RSI[1] * 1000;
  }
  else {
    uVar1 = amqp_get_monotonic_timestamp();
    *in_RDI = uVar1;
    if (*in_RDI == 0) {
      return -0xe;
    }
  }
  if (in_RDI[1] < *in_RDI) {
    local_4 = -0xd;
  }
  else {
    in_RDI[2] = in_RDI[1] - *in_RDI;
    memset(in_RDI + 3,0,0x10);
    in_RDI[3] = in_RDI[2] / 1000000000;
    in_RDI[4] = (in_RDI[2] % 1000000000) / 1000;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
amqp_timer_update(amqp_timer_t *timer, struct timeval *timeout)
{
  if (0 == timer->current_timestamp) {
    timer->current_timestamp = amqp_get_monotonic_timestamp();

    if (0 == timer->current_timestamp) {
      return AMQP_STATUS_TIMER_FAILURE;
    }

    timer->timeout_timestamp = timer->current_timestamp +
                               (uint64_t)timeout->tv_sec * AMQP_NS_PER_S +
                               (uint64_t)timeout->tv_usec * AMQP_NS_PER_US;

  } else {
    timer->current_timestamp = amqp_get_monotonic_timestamp();

    if (0 == timer->current_timestamp) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
  }

  if (timer->current_timestamp > timer->timeout_timestamp) {
    return AMQP_STATUS_TIMEOUT;
  }

  timer->ns_until_next_timeout = timer->timeout_timestamp - timer->current_timestamp;

  memset(&timer->tv, 0, sizeof(struct timeval));
  timer->tv.tv_sec = timer->ns_until_next_timeout / AMQP_NS_PER_S;
  timer->tv.tv_usec = (timer->ns_until_next_timeout % AMQP_NS_PER_S) / AMQP_NS_PER_US;

  return AMQP_STATUS_OK;
}